

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

int __thiscall
Minisat::Heap<Minisat::SimpSolver::ElimLt>::removeMin(Heap<Minisat::SimpSolver::ElimLt> *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  piVar3 = (this->heap).data;
  iVar1 = *piVar3;
  iVar2 = piVar3[(long)(this->heap).sz + -1];
  *piVar3 = iVar2;
  piVar3 = (this->indices).data;
  piVar3[iVar2] = 0;
  piVar3[iVar1] = -1;
  iVar2 = (this->heap).sz;
  (this->heap).sz = iVar2 + -1;
  if (2 < iVar2) {
    percolateDown(this,0);
  }
  return iVar1;
}

Assistant:

void growTo(const Heap<T> &other) { indices.growTo(other.indices.size(), -1); }